

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynastyDeck.cpp
# Opt level: O2

void __thiscall
DynastyDeck::BattleConsequences(DynastyDeck *this,bool attacker,bool won,int ap,int dp)

{
  list<BlackCard_*,_std::allocator<BlackCard_*>_> *plVar1;
  bool bVar2;
  int iVar3;
  Type TVar4;
  undefined3 in_register_00000011;
  _List_node_base *p_Var5;
  Item *pIVar6;
  Item *pIVar7;
  Item *this_00;
  
  plVar1 = &this->dynDeck;
  if (CONCAT31(in_register_00000011,won) == 0) {
    p_Var5 = (_List_node_base *)plVar1;
    if (attacker) {
      while (p_Var5 = (((_List_base<BlackCard_*,_std::allocator<BlackCard_*>_> *)&p_Var5->_M_next)->
                      _M_impl)._M_node.super__List_node_base._M_next,
            p_Var5 != (_List_node_base *)plVar1) {
        bVar2 = BlackCard::isTapped((BlackCard *)p_Var5[1]._M_next);
        if (!bVar2) {
          popCard(this,(BlackCard *)p_Var5[1]._M_next);
          if (p_Var5[1]._M_next != (_List_node_base *)0x0) {
            (**(code **)(*(long *)p_Var5[1]._M_next + 0x18))();
          }
        }
      }
    }
    else {
      while (p_Var5 = (((_List_base<BlackCard_*,_std::allocator<BlackCard_*>_> *)&p_Var5->_M_next)->
                      _M_impl)._M_node.super__List_node_base._M_next,
            p_Var5 != (_List_node_base *)plVar1) {
        bVar2 = BlackCard::isTapped((BlackCard *)p_Var5[1]._M_next);
        if (bVar2) {
          popCard(this,(BlackCard *)p_Var5[1]._M_next);
          if (p_Var5[1]._M_next != (_List_node_base *)0x0) {
            (**(code **)(*(long *)p_Var5[1]._M_next + 0x18))();
          }
        }
      }
    }
  }
  else {
    p_Var5 = (_List_node_base *)plVar1;
    pIVar7 = (Item *)0x0;
    this_00 = (Item *)0x0;
    if (attacker) {
LAB_0010631f:
      p_Var5 = (((_List_base<BlackCard_*,_std::allocator<BlackCard_*>_> *)&p_Var5->_M_next)->_M_impl
               )._M_node.super__List_node_base._M_next;
      if (p_Var5 != (_List_node_base *)plVar1) {
        bVar2 = BlackCard::isTapped((BlackCard *)p_Var5[1]._M_next);
        if (!bVar2) {
          this_00 = (Item *)p_Var5[1]._M_next;
          iVar3 = Personality::getAttack((Personality *)this_00);
          if (iVar3 < ap - dp) {
            BlackCard::setTapped((BlackCard *)p_Var5[1]._M_next,true);
            TVar4 = Card::getType((Card *)p_Var5[1]._M_next);
            pIVar6 = (Item *)p_Var5[1]._M_next;
            if (TVar4 != PERSONALITY) {
              BlackCard::setTapped((BlackCard *)pIVar6,true);
              TVar4 = Card::getType((Card *)p_Var5[1]._M_next);
              pIVar6 = (Item *)p_Var5[1]._M_next;
              if (TVar4 != PERSONALITY) {
                iVar3 = Item::getDurability(pIVar6);
                Item::setDurability(pIVar6,iVar3 + -1);
                pIVar7 = pIVar6;
                goto LAB_0010631f;
              }
            }
            Personality::PersonalityConsequences((Personality *)pIVar6);
            this_00 = pIVar6;
            goto LAB_0010631f;
          }
          popCard(this,(BlackCard *)p_Var5[1]._M_next);
          if (p_Var5[1]._M_next != (_List_node_base *)0x0) {
            (**(code **)(*(long *)p_Var5[1]._M_next + 0x18))();
          }
        }
        goto LAB_0010631f;
      }
    }
    else {
      while (p_Var5 = (((_List_base<BlackCard_*,_std::allocator<BlackCard_*>_> *)&p_Var5->_M_next)->
                      _M_impl)._M_node.super__List_node_base._M_next,
            p_Var5 != (_List_node_base *)plVar1) {
        bVar2 = BlackCard::isTapped((BlackCard *)p_Var5[1]._M_next);
        if (!bVar2) {
          this_00 = (Item *)p_Var5[1]._M_next;
          iVar3 = Personality::getAttack((Personality *)this_00);
          if (iVar3 < ap - dp) {
            BlackCard::setTapped((BlackCard *)p_Var5[1]._M_next,true);
            TVar4 = Card::getType((Card *)p_Var5[1]._M_next);
            pIVar6 = (Item *)p_Var5[1]._M_next;
            if (TVar4 == PERSONALITY) {
              Personality::PersonalityConsequences((Personality *)pIVar6);
              this_00 = pIVar6;
            }
            else {
              iVar3 = Item::getDurability(pIVar6);
              Item::setDurability(pIVar6,iVar3 + -1);
              pIVar7 = pIVar6;
            }
          }
          else {
            popCard(this,(BlackCard *)p_Var5[1]._M_next);
            if (p_Var5[1]._M_next != (_List_node_base *)0x0) {
              (**(code **)(*(long *)p_Var5[1]._M_next + 0x18))();
            }
          }
        }
      }
    }
    if (this_00 != (Item *)0x0) {
      (*(this_00->super_GreenCard).super_Card._vptr_Card[3])(this_00);
    }
    if (pIVar7 != (Item *)0x0) {
      (*(pIVar7->super_GreenCard).super_Card._vptr_Card[3])(pIVar7);
      return;
    }
  }
  return;
}

Assistant:

void DynastyDeck::BattleConsequences(bool attacker, bool won, int ap, int dp)                 //changes armies of player according to battle state
{
    list <BlackCard*>::iterator it;
    Personality* pers = nullptr;
    Item* item = nullptr;

    if (won)
    {
        if (attacker)
        {
            for (it=dynDeck.begin(); it!=dynDeck.end(); it++)
            {
                if ((*it)->isTapped())
                    continue;

                pers = reinterpret_cast<Personality*>(*it);
                if (pers->getAttack() >= ap - dp)
                {
                    popCard(*it);
                    delete *it;
                }
                else
                {
                    (*it)->setTapped(true);

                    if ((*it)->getType() == Card::PERSONALITY)
                    {
                        pers = reinterpret_cast<Personality*>(*it);
                        pers->PersonalityConsequences();
                    }
                    else
                    {
                        (*it)->setTapped(true);

                        if ((*it)->getType() == Card::PERSONALITY)
                        {
                            pers = reinterpret_cast<Personality*>(*it);
                            pers->PersonalityConsequences();
                        }
                        else
                        {
                            item = reinterpret_cast<Item*>(*it);
                            item->setDurability(item->getDurability() - 1);
                        }
                    }
                }
            }
        }
        else
        {
            for (it=dynDeck.begin(); it!=dynDeck.end(); it++)
            {
                if ((*it)->isTapped())
                    continue;

                pers = reinterpret_cast<Personality*>(*it);
                if (pers->getAttack() >= ap - dp)
                {
                    popCard(*it);
                    delete *it;
                }
                else
                {
                    (*it)->setTapped(true);

                    if ((*it)->getType() == Card::PERSONALITY)
                    {
                        pers = reinterpret_cast<Personality*>(*it);
                        pers->PersonalityConsequences();
                    }
                    else
                    {
                        item = reinterpret_cast<Item*>(*it);
                        item->setDurability(item->getDurability() - 1);
                    }
                }
            }
        }
    }
    else
    {
        if (attacker)
        {
            for (it=dynDeck.begin(); it!=dynDeck.end(); it++)
            {
                if ((*it)->isTapped())
                    continue;

                popCard(*it);
                delete *it;
            }
        }
        else
        {
            for (it=dynDeck.begin(); it!=dynDeck.end(); it++)
            {
                if (!(*it)->isTapped())
                    continue;

                popCard(*it);
                delete *it;
            }
        }
    }
    delete pers;
    delete item;
}